

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O0

void test_timer_cancel_errors(void)

{
  cio_inet_address *arg1;
  undefined1 local_260 [8];
  cio_http_location target;
  undefined1 local_238 [4];
  cio_error err;
  cio_http_server server;
  cio_http_server_configuration config;
  code *pcStack_28;
  uint i;
  _func_cio_error_cio_timer_ptr *timer_cancel_fakes [3];
  
  for (config.free_client._4_4_ = 0; config.free_client._4_4_ < 3;
      config.free_client._4_4_ = config.free_client._4_4_ + 1) {
    pcStack_28 = cancel_timer;
    timer_cancel_fakes[0] = cancel_timer;
    timer_cancel_fakes[1] = cancel_timer;
    *(code **)((long)&stack0xffffffffffffffd8 + (ulong)config.free_client._4_4_ * 8) =
         cancel_timer_error;
    cio_timer_cancel_fake.custom_fake = (_func_cio_error_cio_timer_ptr *)0x0;
    cio_timer_cancel_fake.custom_fake_seq = &stack0xffffffffffffffd8;
    cio_timer_cancel_fake.custom_fake_seq_len = 3;
    header_complete_fake.custom_fake = callback_write_ok_response;
    memcpy(server.keepalive_header + 0x20,&DAT_00124ba0,0xb8);
    arg1 = cio_get_inet_address_any4();
    cio_init_inet_socket_address((cio_socket_address *)(server.keepalive_header + 0x20),arg1,0x1f90)
    ;
    target.config._4_4_ =
         cio_http_server_init
                   ((cio_http_server *)local_238,&loop,
                    (cio_http_server_configuration *)(server.keepalive_header + 0x20));
    UnityAssertEqualNumber
              (0,(long)target.config._4_4_,"Server initialization failed!",0x73e,
               UNITY_DISPLAY_STYLE_INT);
    target.config._4_4_ =
         cio_http_location_init
                   ((cio_http_location *)local_260,"/foo",(void *)0x0,alloc_dummy_handler);
    UnityAssertEqualNumber
              (0,(long)target.config._4_4_,"Request target initialization failed!",0x742,
               UNITY_DISPLAY_STYLE_INT);
    target.config._4_4_ =
         cio_http_server_register_location
                   ((cio_http_server *)local_238,(cio_http_location *)local_260);
    UnityAssertEqualNumber
              (0,(long)target.config._4_4_,"Register request target failed!",0x744,
               UNITY_DISPLAY_STYLE_INT);
    split_request("GET /foo HTTP/1.1\r\n\r\n");
    target.config._4_4_ = cio_http_server_serve((cio_http_server *)local_238);
    UnityAssertEqualNumber
              (0,(long)target.config._4_4_,"Serving http failed!",0x748,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)serve_error_fake.call_count,"Serve error callback was not called!",0x74a,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)cio_buffered_stream_close_fake.call_count,
               "buffered stream was not closed after keepalive timeout triggered!",0x74c,
               UNITY_DISPLAY_STYLE_INT);
    setUp();
  }
  free_dummy_client(client_socket);
  return;
}

Assistant:

static void test_timer_cancel_errors(void)
{
	enum cio_error (*timer_cancel_fakes[3])(struct cio_timer *timer);

	for (unsigned int i = 0; i < ARRAY_SIZE(timer_cancel_fakes); i++) {
		timer_cancel_fakes[0] = cancel_timer;
		timer_cancel_fakes[1] = cancel_timer;
		timer_cancel_fakes[2] = cancel_timer;

		timer_cancel_fakes[i] = cancel_timer_error;

		cio_timer_cancel_fake.custom_fake = NULL;
		SET_CUSTOM_FAKE_SEQ(cio_timer_cancel, timer_cancel_fakes, ARRAY_SIZE(timer_cancel_fakes))

		header_complete_fake.custom_fake = callback_write_ok_response;

		struct cio_http_server_configuration config = {
		    .on_error = serve_error,
		    .read_header_timeout_ns = header_read_timeout,
		    .read_body_timeout_ns = body_read_timeout,
		    .response_timeout_ns = response_timeout,
		    .close_timeout_ns = 10,
		    .alloc_client = alloc_dummy_client,
		    .free_client = free_dummy_client};

		cio_init_inet_socket_address(&config.endpoint, cio_get_inet_address_any4(), 8080);

		struct cio_http_server server;
		enum cio_error err = cio_http_server_init(&server, &loop, &config);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Server initialization failed!");

		struct cio_http_location target;
		err = cio_http_location_init(&target, "/foo", NULL, alloc_dummy_handler);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Request target initialization failed!");
		err = cio_http_server_register_location(&server, &target);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Register request target failed!");

		split_request("GET /foo HTTP/1.1" CRLF CRLF);
		err = cio_http_server_serve(&server);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Serving http failed!");

		TEST_ASSERT_EQUAL_MESSAGE(1, serve_error_fake.call_count, "Serve error callback was not called!");

		TEST_ASSERT_EQUAL_MESSAGE(1, cio_buffered_stream_close_fake.call_count, "buffered stream was not closed after keepalive timeout triggered!");

		setUp();
	}

	free_dummy_client(client_socket);
}